

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O2

int main(int argc,char **argv)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  pointer paVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  bool bVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  ostream *poVar22;
  ulong extraout_RAX;
  pointer paVar23;
  char *__ptr;
  int iVar24;
  ulong uVar25;
  ulong uVar26;
  uint uVar27;
  size_t i;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  pointer paVar28;
  int iVar29;
  int iVar30;
  float fVar31;
  float fVar32;
  result_type_conflict rVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  int comp;
  undefined1 local_a18 [8];
  float fStack_a10;
  float fStack_a0c;
  double local_a08;
  float local_9fc;
  float local_9f8;
  float local_9f4;
  float local_9f0;
  float local_9ec;
  float local_9e8;
  float local_9e4;
  float local_9e0;
  float local_9dc;
  float local_9d8;
  float local_9d4;
  int h;
  int w;
  undefined1 local_9c8 [8];
  float fStack_9c0;
  float fStack_9bc;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  float n [3] [3];
  vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_> shapes;
  undefined1 local_928 [8];
  float fStack_920;
  float fStack_91c;
  string base_dir;
  default_random_engine generator;
  string filename;
  uniform_real_distribution<double> local_858;
  string err;
  string warn;
  attrib_t attrib;
  float v [3] [3];
  _Rb_tree_node_base local_58;
  size_t local_38;
  
  iVar29 = 1;
  if (argc < 2) {
    printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
  }
  else {
    if (argc == 2) {
      fVar31 = 10000.0;
    }
    else {
      std::__cxx11::string::string((string *)v,argv[2],(allocator *)&attrib);
      iVar29 = std::__cxx11::stoi((string *)v,(size_t *)0x0,10);
      std::__cxx11::string::~string((string *)v);
      fVar31 = (float)iVar29;
    }
    puts("# pc sampler");
    generator._M_x = 1;
    local_858._M_param._M_a = 0.0;
    local_858._M_param._M_b = 1.0;
    memset(&attrib,0,0x90);
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    warn._M_dataplus._M_p = (pointer)&warn.field_2;
    warn._M_string_length = 0;
    warn.field_2._M_local_buf[0] = '\0';
    err._M_dataplus._M_p = (pointer)&err.field_2;
    err._M_string_length = 0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    err.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string((string *)&filename,argv[1],(allocator *)v);
    lVar20 = std::__cxx11::string::find_last_of((char *)&filename,0x121bb2);
    if (lVar20 == -1) {
      std::__cxx11::string::string((string *)&base_dir,"",(allocator *)v);
    }
    else {
      std::__cxx11::string::find_last_of((char *)&filename,0x121bb2);
      std::__cxx11::string::substr((ulong)&base_dir,(ulong)&filename);
    }
    if (base_dir._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&base_dir);
    }
    std::__cxx11::string::append((char *)&base_dir);
    tinyobj::LoadObj(&attrib,&shapes,&materials,&warn,&err,filename._M_dataplus._M_p,
                     base_dir._M_dataplus._M_p,true,true);
    uVar21 = (ulong)((long)attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                    (long)attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar21 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    iVar24 = 0;
    printf("# of vertices  = %d\n",(long)uVar21 / 3 & 0xffffffff,(long)uVar21 % 3 & 0xffffffff);
    uVar21 = (ulong)((long)attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
    uVar21 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    printf("# of normals   = %d\n",(long)uVar21 / 3 & 0xffffffff,(long)uVar21 % 3 & 0xffffffff);
    uVar21 = (ulong)((long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl
                          .super__Vector_impl_data._M_start) >> 2;
    uVar21 = (ulong)(uint)((int)uVar21 >> 0x1f) << 0x20 | uVar21 & 0xffffffff;
    printf("# of texcoords = %d\n",(long)uVar21 / 2 & 0xffffffff,(long)uVar21 % 2 & 0xffffffff);
    iVar29 = 0x748;
    printf("# of materials = %d\n",
           ((long)materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)materials.
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0x748 & 0xffffffff,
           ((long)materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)materials.
                 super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                 _M_impl.super__Vector_impl_data._M_start) % 0x748);
    printf("# of shapes    = %d\n",
           ((long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start) / 0xe0 & 0xffffffff,
           ((long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
           (long)shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start) % 0xe0);
    memset(v[1] + 1,0,0x718);
    v[0][2] = 0.0;
    v[1][0] = 0.0;
    local_58._M_left = &local_58;
    local_58._M_parent = (_Base_ptr)0x0;
    local_38 = 0;
    v[0]._0_8_ = v[1] + 1;
    local_58._M_right = local_58._M_left;
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::
    emplace_back<tinyobj::material_t>(&materials,(anon_struct_1864_47_e17b0a7f *)v);
    tinyobj::anon_struct_1864_47_e17b0a7f::~material_t((anon_struct_1864_47_e17b0a7f *)v);
    lVar20 = 0x90;
    __ptr = "# material[%d].diffuse_texname = %s\n";
    uVar21 = 0;
    while( true ) {
      if ((ulong)(((long)materials.
                         super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                  (long)materials.
                        super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                        ._M_impl.super__Vector_impl_data._M_start) / 0x748) <= uVar21) break;
      printf("# material[%d].diffuse_texname = %s\n",uVar21 & 0xffffffff,
             *(undefined8 *)
              ((long)(materials.
                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                      _M_impl.super__Vector_impl_data._M_start)->ambient + lVar20 + -0x20));
      uVar21 = uVar21 + 1;
      lVar20 = lVar20 + 0x748;
    }
    lVar20 = 0x90;
    paVar23 = materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_finish;
    paVar28 = materials.
              super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
              super__Vector_impl_data._M_start;
    for (uVar21 = 0; uVar21 < (ulong)(((long)paVar23 - (long)paVar28) / 0x748); uVar21 = uVar21 + 1)
    {
      if (*(long *)((long)paVar28->ambient + lVar20 + -0x18) != 0) {
        __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                ((long)paVar28->ambient + lVar20 + -0x20);
        std::__cxx11::string::string((string *)v,(string *)__rhs);
        bVar17 = FileExists((string *)v);
        if (!bVar17) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)n,
                         &base_dir,__rhs);
          std::__cxx11::string::operator=((string *)v,(string *)n);
          std::__cxx11::string::~string((string *)n);
          bVar17 = FileExists((string *)v);
          if (!bVar17) {
            poVar22 = std::operator<<((ostream *)&std::cerr,"# Unable to find file: ");
            poVar22 = std::operator<<(poVar22,(string *)__rhs);
            std::endl<char,std::char_traits<char>>(poVar22);
            goto LAB_00114380;
          }
        }
        __ptr = (char *)stbi_load((char *)v[0]._0_8_,&w,&h,&comp,0);
        if ((stbi_uc *)__ptr == (stbi_uc *)0x0) {
          poVar22 = std::operator<<((ostream *)&std::cerr,"# Unable to load texture: ");
          poVar22 = std::operator<<(poVar22,(string *)v);
          std::endl<char,std::char_traits<char>>(poVar22);
LAB_00114380:
          exit(1);
        }
        poVar22 = std::operator<<((ostream *)&std::cout,"# Loaded texture: ");
        poVar22 = std::operator<<(poVar22,(string *)v);
        poVar22 = std::operator<<(poVar22,", w = ");
        iVar24 = w;
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,w);
        poVar22 = std::operator<<(poVar22,", h = ");
        iVar29 = h;
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,h);
        poVar22 = std::operator<<(poVar22,", comp = ");
        poVar22 = (ostream *)std::ostream::operator<<(poVar22,comp);
        std::endl<char,std::char_traits<char>>(poVar22);
        std::__cxx11::string::~string((string *)v);
        paVar23 = materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        paVar28 = materials.
                  super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>.
                  _M_impl.super__Vector_impl_data._M_start;
      }
      lVar20 = lVar20 + 0x748;
    }
    local_9f8 = (float)iVar24;
    local_9fc = (float)iVar29;
    uVar21 = 0;
    while( true ) {
      paVar7 = ((shapes.super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                 _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
               super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((ulong)(((long)((shapes.
                           super__Vector_base<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>.
                           _M_impl.super__Vector_impl_data._M_start)->mesh).indices.
                         super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                         _M_impl.super__Vector_impl_data._M_finish - (long)paVar7) / 0xc) / 3 <=
          uVar21) break;
      iVar29 = paVar7[uVar21 * 3].vertex_index;
      iVar30 = paVar7[uVar21 * 3].normal_index;
      iVar3 = paVar7[uVar21 * 3 + 1].vertex_index;
      iVar4 = paVar7[uVar21 * 3 + 1].normal_index;
      local_a08 = (double)CONCAT44(local_a08._4_4_,iVar4);
      iVar5 = paVar7[uVar21 * 3 + 2].vertex_index;
      iVar6 = paVar7[uVar21 * 3 + 2].normal_index;
      _local_928 = ZEXT816(0);
      if ((long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_start == 0) {
LAB_00113c4c:
        _local_9c8 = ZEXT816(0);
        _local_a18 = ZEXT816(0);
      }
      else {
        uVar18 = paVar7[uVar21 * 3].texcoord_index;
        if (((int)uVar18 < 0) || (uVar27 = paVar7[uVar21 * 3 + 1].texcoord_index, (int)uVar27 < 0))
        goto LAB_00113c4c;
        uVar19 = paVar7[uVar21 * 3 + 2].texcoord_index;
        _local_9c8 = ZEXT816(0);
        _local_a18 = ZEXT816(0);
        if (-1 < (int)uVar19) {
          uVar25 = (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2;
          uVar26 = (ulong)uVar18 * 2 + 1;
          if (uVar25 <= uVar26) {
            __assert_fail("attrib.texcoords.size() > size_t(2 * idx0.texcoord_index + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                          ,0x94,"int main(int, char **)");
          }
          uVar1 = (ulong)uVar27 * 2 + 1;
          if (uVar25 <= uVar1) {
            __assert_fail("attrib.texcoords.size() > size_t(2 * idx1.texcoord_index + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                          ,0x96,"int main(int, char **)");
          }
          uVar2 = (ulong)uVar19 * 2 + 1;
          if (uVar25 <= uVar2) {
            __assert_fail("attrib.texcoords.size() > size_t(2 * idx2.texcoord_index + 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                          ,0x98,"int main(int, char **)");
          }
          local_928._0_4_ =
               1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar2];
          local_928._4_4_ =
               attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(ulong)uVar19 * 2 & 0xffffffff];
          register0x00001248 = 0;
          local_9c8._4_4_ =
               attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[uVar18 * 2];
          local_9c8._0_4_ =
               1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar26];
          unique0x10000273 = 0;
          local_a18._4_4_ =
               attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start[(ulong)uVar27 * 2 & 0xffffffff];
          local_a18._0_4_ =
               1.0 - attrib.texcoords.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar1];
          unique0x1000032f = 0;
        }
      }
      for (lVar20 = 0; fVar16 = v[2][2], fVar15 = v[2][1], fVar14 = v[2][0], fVar40 = v[1][2],
          fVar38 = v[1][1], lVar20 != 3; lVar20 = lVar20 + 1) {
        if (iVar29 < 0) {
          __assert_fail("vi[0] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbc,"int main(int, char **)");
        }
        if (iVar3 < 0) {
          __assert_fail("vi[1] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbd,"int main(int, char **)");
        }
        if (iVar5 < 0) {
          __assert_fail("vi[2] >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/fxia22[P]pc_sampler/main.cc"
                        ,0xbe,"int main(int, char **)");
        }
        v[0][lVar20] = attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(ulong)(uint)(iVar29 * 3) + lVar20];
        v[1][lVar20] = attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(ulong)(uint)(iVar3 * 3) + lVar20];
        fVar38 = (float)(int)lVar20;
        fVar40 = (float)iVar30 * 3.0 + fVar38;
        uVar26 = (ulong)fVar40;
        v[2][lVar20] = attrib.vertices.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[(ulong)(uint)(iVar5 * 3) + lVar20];
        n[0][lVar20] = attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(long)(fVar40 - 9.223372e+18) & (long)uVar26 >> 0x3f | uVar26];
        fVar40 = (float)iVar4 * 3.0 + fVar38;
        uVar26 = (ulong)fVar40;
        n[1][lVar20] = attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(long)(fVar40 - 9.223372e+18) & (long)uVar26 >> 0x3f | uVar26];
        fVar38 = fVar38 + (float)iVar6 * 3.0;
        uVar26 = (ulong)fVar38;
        n[2][lVar20] = attrib.normals.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start
                       [(long)(fVar38 - 9.223372e+18) & (long)uVar26 >> 0x3f | uVar26];
      }
      fVar10 = v[0][0];
      fVar11 = v[0][1];
      fVar13 = v[1][0];
      fVar12 = v[0][2];
      fVar32 = SQRT((v[0][2] - v[1][2]) * (v[0][2] - v[1][2]) +
                    (v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) +
                    (v[0][1] - v[1][1]) * (v[0][1] - v[1][1]));
      auVar34._0_4_ =
           (v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) + (v[0][1] - v[2][1]) * (v[0][1] - v[2][1]);
      auVar34._4_4_ =
           (v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) + (v[2][1] - v[1][1]) * (v[2][1] - v[1][1]);
      auVar34._8_8_ = 0;
      auVar35._4_4_ = (v[2][2] - v[1][2]) * (v[2][2] - v[1][2]) + auVar34._4_4_;
      auVar35._0_4_ = (v[0][2] - v[2][2]) * (v[0][2] - v[2][2]) + auVar34._0_4_;
      auVar35._8_8_ = 0;
      auVar35 = sqrtps(auVar34,auVar35);
      fVar36 = (auVar35._4_4_ + fVar32 + auVar35._0_4_) * 0.5;
      fVar32 = (fVar36 - auVar35._4_4_) * (fVar36 - fVar32) * fVar36 * (fVar36 - auVar35._0_4_);
      if (fVar32 < 0.0) {
        fVar32 = sqrtf(fVar32);
      }
      else {
        fVar32 = SQRT(fVar32);
      }
      uVar27 = (uint)(fVar31 * fVar32);
      uVar18 = printf("# area %f nsamples %d \n",(double)fVar32,(ulong)uVar27);
      uVar26 = (ulong)uVar18;
      local_a18._4_4_ = (float)local_a18._4_4_ - (float)local_9c8._4_4_;
      local_a18._0_4_ = (float)local_a18._0_4_ - (float)local_9c8._0_4_;
      fStack_a10 = fStack_a10 - fStack_9c0;
      fStack_a0c = fStack_a0c - fStack_9bc;
      local_928._0_4_ = (float)local_928._0_4_ - (float)local_9c8._0_4_;
      fVar32 = (float)local_928._4_4_ - (float)local_9c8._4_4_;
      fStack_920 = fStack_920 - fStack_9c0;
      fStack_91c = fStack_91c - fStack_9bc;
      local_9dc = n[1][0] - n[0][0];
      local_9d4 = n[0][0];
      local_9e0 = n[2][0] - n[0][0];
      local_9e4 = n[1][1] - n[0][1];
      local_9d8 = n[0][1];
      local_9e8 = n[2][1] - n[0][1];
      local_9f0 = n[1][2] - n[0][2];
      local_9ec = n[0][2];
      local_9f4 = n[2][2] - n[0][2];
      uVar18 = 0;
      if ((int)uVar27 < 1) {
        uVar27 = 0;
        uVar18 = 0;
      }
      for (; uVar18 != uVar27; uVar18 = uVar18 + 1) {
        fVar41 = 1.0;
        fVar36 = 1.0;
        while (1.0 < fVar36 + fVar41) {
          local_a08 = std::uniform_real_distribution<double>::operator()(&local_858,&generator);
          rVar33 = std::uniform_real_distribution<double>::operator()(&local_858,&generator);
          fVar41 = (float)rVar33;
          uVar26 = extraout_RAX;
          fVar36 = (float)local_a08;
        }
        auVar8._4_4_ = fVar41 * fVar32 + fVar36 * (float)local_a18._4_4_ + (float)local_9c8._4_4_;
        auVar8._0_4_ = fVar41 * (float)local_928._0_4_ +
                       fVar36 * (float)local_a18._0_4_ + (float)local_9c8._0_4_;
        auVar8._8_4_ = fVar41 * fStack_920 + fVar36 * fStack_a10 + fStack_9c0;
        auVar8._12_4_ = fVar41 * fStack_91c + fVar36 * fStack_a0c + fStack_9bc;
        auVar35 = maxps(ZEXT816(0),auVar8);
        iVar29 = -(uint)(1.0 < auVar35._0_4_);
        iVar30 = -(uint)(1.0 < auVar35._4_4_);
        auVar9._4_4_ = iVar29;
        auVar9._0_4_ = iVar29;
        auVar9._8_4_ = iVar30;
        auVar9._12_4_ = iVar30;
        uVar19 = movmskpd((int)uVar26,auVar9);
        fVar37 = 1.0;
        if ((uVar19 & 2) == 0) {
          fVar37 = auVar35._4_4_;
        }
        fVar39 = 1.0;
        if ((uVar19 & 1) == 0) {
          fVar39 = auVar35._0_4_;
        }
        lVar20 = (long)((int)(fVar39 * local_9fc) * iVar24 + (int)(fVar37 * local_9f8)) * (long)comp
        ;
        uVar19 = printf("%f %f %f %f %f %f %d %d %d\n",
                        (double)(fVar41 * (fVar14 - fVar10) + fVar36 * (fVar13 - fVar10) + fVar10),
                        (double)(fVar41 * (fVar15 - fVar11) + fVar36 * (fVar38 - fVar11) + fVar11),
                        SUB84((double)(fVar41 * (fVar16 - fVar12) +
                                      fVar36 * (fVar40 - fVar12) + fVar12),0),
                        SUB84((double)(fVar41 * local_9e0 + fVar36 * local_9dc + local_9d4),0),
                        SUB84((double)(fVar41 * local_9e8 + fVar36 * local_9e4 + local_9d8),0),
                        SUB84((double)(fVar41 * local_9f4 + fVar36 * local_9f0 + local_9ec),0),
                        (ulong)((stbi_uc *)__ptr)[lVar20],(ulong)((stbi_uc *)__ptr)[lVar20 + 1],
                        (ulong)((stbi_uc *)__ptr)[lVar20 + 2]);
        uVar26 = (ulong)uVar19;
      }
      uVar21 = uVar21 + 1;
    }
    free(__ptr);
    std::__cxx11::string::~string((string *)&base_dir);
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&err);
    std::__cxx11::string::~string((string *)&warn);
    std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector(&materials);
    std::vector<tinyobj::shape_t,_std::allocator<tinyobj::shape_t>_>::~vector(&shapes);
    tinyobj::attrib_t::~attrib_t(&attrib);
    iVar29 = 0;
  }
  return iVar29;
}

Assistant:

int main(int argc, char ** argv){

    int point_per_sqm = 10000;

    if (argc < 2) {
      printf("./pc_sampler mesh.obj <optional: points per square meter> > pc.xyz");
      return 1;
    }
    if (argc >= 3) {
      point_per_sqm = std::stoi(argv[2]);
    }

    printf("# pc sampler\n");
    std::default_random_engine generator;
    std::uniform_real_distribution<double> distribution(0.0,1.0);

    tinyobj::attrib_t attrib;
    std::vector<tinyobj::shape_t> shapes;
    std::vector<tinyobj::material_t> materials;

    std::string warn;
    std::string err;

    std::string filename(argv[1]);
    std::string base_dir = GetBaseDir(filename);
    if (base_dir.empty()) {
        base_dir = ".";
    }

    base_dir += "/";


    bool ret = tinyobj::LoadObj(&attrib, &shapes, &materials, &warn, &err, filename.c_str(),
                              base_dir.c_str());

    printf("# of vertices  = %d\n", (int)(attrib.vertices.size()) / 3);
    printf("# of normals   = %d\n", (int)(attrib.normals.size()) / 3);
    printf("# of texcoords = %d\n", (int)(attrib.texcoords.size()) / 2);
    printf("# of materials = %d\n", (int)materials.size());
    printf("# of shapes    = %d\n", (int)shapes.size());

    materials.push_back(tinyobj::material_t());
    unsigned char* image;
     int w, h;
      int comp;

    for (size_t i = 0; i < materials.size(); i++) {
        printf("# material[%d].diffuse_texname = %s\n", int(i),
        materials[i].diffuse_texname.c_str());
    }

    {
    for (size_t m = 0; m < materials.size(); m++) {
      tinyobj::material_t* mp = &materials[m];

      if (mp->diffuse_texname.length() > 0) {
        // Only load the texture if it is not already loaded
        {
         

          std::string texture_filename = mp->diffuse_texname;
          if (!FileExists(texture_filename)) {
            // Append base dir.
            texture_filename = base_dir + mp->diffuse_texname;
            if (!FileExists(texture_filename)) {
              std::cerr << "# Unable to find file: " << mp->diffuse_texname
                        << std::endl;
              exit(1);
            }
          }

          image = stbi_load(texture_filename.c_str(), &w, &h, &comp, STBI_default);
          if (!image) {
            std::cerr << "# Unable to load texture: " << texture_filename
                      << std::endl;
            exit(1);
          }
          std::cout << "# Loaded texture: " << texture_filename << ", w = " << w
                    << ", h = " << h << ", comp = " << comp << std::endl;
        }
      }
    }
  }

    int s = 0; //take first shape

    for (size_t f = 0; f < shapes[s].mesh.indices.size() / 3; f++) {

        tinyobj::index_t idx0 = shapes[s].mesh.indices[3 * f + 0];
        tinyobj::index_t idx1 = shapes[s].mesh.indices[3 * f + 1];
        tinyobj::index_t idx2 = shapes[s].mesh.indices[3 * f + 2];

        int current_material_id = shapes[s].mesh.material_ids[f];

        if ((current_material_id < 0) ||
            (current_material_id >= static_cast<int>(materials.size()))) {
          // Invaid material ID. Use default material.
          current_material_id =
              materials.size() -
              1;  // Default material is added to the last item in `materials`.
        }
        
       float tc[3][2];
        if (attrib.texcoords.size() > 0) {
          if ((idx0.texcoord_index < 0) || (idx1.texcoord_index < 0) ||
              (idx2.texcoord_index < 0)) {
            // face does not contain valid uv index.
            tc[0][0] = 0.0f;
            tc[0][1] = 0.0f;
            tc[1][0] = 0.0f;
            tc[1][1] = 0.0f;
            tc[2][0] = 0.0f;
            tc[2][1] = 0.0f;
          } else {
            assert(attrib.texcoords.size() >
                   size_t(2 * idx0.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx1.texcoord_index + 1));
            assert(attrib.texcoords.size() >
                   size_t(2 * idx2.texcoord_index + 1));

            // Flip Y coord.
            tc[0][0] = attrib.texcoords[2 * idx0.texcoord_index];
            tc[0][1] = 1.0f - attrib.texcoords[2 * idx0.texcoord_index + 1];
            tc[1][0] = attrib.texcoords[2 * idx1.texcoord_index];
            tc[1][1] = 1.0f - attrib.texcoords[2 * idx1.texcoord_index + 1];
            tc[2][0] = attrib.texcoords[2 * idx2.texcoord_index];
            tc[2][1] = 1.0f - attrib.texcoords[2 * idx2.texcoord_index + 1];
          }
        } else {
          tc[0][0] = 0.0f;
          tc[0][1] = 0.0f;
          tc[1][0] = 0.0f;
          tc[1][1] = 0.0f;
          tc[2][0] = 0.0f;
          tc[2][1] = 0.0f;
        }

        //printf("%f %f %f %f %f %f\n", tc[0][0], tc[0][1], tc[1][0], tc[1][1], tc[2][0], tc[2][1]);
        
        int vi[3];      // indexes
        float v[3][3];  // coordinates
        float ni[3];
        float n[3][3];


         for (int k = 0; k < 3; k++) {
          vi[0] = idx0.vertex_index;
          vi[1] = idx1.vertex_index;
          vi[2] = idx2.vertex_index;
          
          ni[0] = idx0.normal_index;
          ni[1] = idx1.normal_index;
          ni[2] = idx2.normal_index;

          assert(vi[0] >= 0);
          assert(vi[1] >= 0);
          assert(vi[2] >= 0);

          v[0][k] = attrib.vertices[3 * vi[0] + k];
          v[1][k] = attrib.vertices[3 * vi[1] + k];
          v[2][k] = attrib.vertices[3 * vi[2] + k];
        
          n[0][k] = attrib.normals[3 * ni[0] + k];
          n[1][k] = attrib.normals[3 * ni[1] + k];
          n[2][k] = attrib.normals[3 * ni[2] + k];
        

        }

        float area;

        float l0 = sqrt((v[0][0] - v[1][0]) * (v[0][0] - v[1][0]) + (v[0][1] - v[1][1]) * (v[0][1] - v[1][1]) + (v[0][2] - v[1][2]) * (v[0][2] - v[1][2]));
        float l1 = sqrt((v[2][0] - v[1][0]) * (v[2][0] - v[1][0]) + (v[2][1] - v[1][1]) * (v[2][1] - v[1][1]) + (v[2][2] - v[1][2]) * (v[2][2] - v[1][2]));
        float l2 = sqrt((v[0][0] - v[2][0]) * (v[0][0] - v[2][0]) + (v[0][1] - v[2][1]) * (v[0][1] - v[2][1]) + (v[0][2] - v[2][2]) * (v[0][2] - v[2][2]));
        
        float s = (l0 + l1 + l2)/2;

        area = sqrt(s * (s-l0) * (s-l1) * (s-l2));
        
        int nsamples = int(area * point_per_sqm);
        printf("# area %f nsamples %d \n", area, nsamples);
        

        for (int j = 0; j < nsamples; j++) {
            float lambda_a = 1;
            float lambda_b = 1;

            while (lambda_a + lambda_b > 1) {
              lambda_a = distribution(generator);
              lambda_b = distribution(generator);
            }

            float coordx = tc[0][0] + lambda_a * (tc[1][0] - tc[0][0]) + lambda_b*(tc[2][0] - tc[0][0]);
            float coordy = tc[0][1] + lambda_a * (tc[1][1] - tc[0][1]) + lambda_b*(tc[2][1] - tc[0][1]);

            if (coordx < 0) coordx = 0;
            if (coordx > 1) coordx = 1;
            if (coordy < 0) coordy = 0;
            if (coordy > 1) coordy = 1;

            int x = int(coordx * w);
            int y = int(coordy * h);

            unsigned char r = image[comp*(y * w + x)];
            unsigned char g = image[comp*(y * w + x) + 1];
            unsigned char b = image[comp*(y * w + x) + 2];

            float px = v[0][0] + lambda_a*(v[1][0] - v[0][0]) + lambda_b*(v[2][0] - v[0][0]);
            float py = v[0][1] + lambda_a*(v[1][1] - v[0][1]) + lambda_b*(v[2][1] - v[0][1]);
            float pz = v[0][2] + lambda_a*(v[1][2] - v[0][2]) + lambda_b*(v[2][2] - v[0][2]);

            float nx = n[0][0] + lambda_a*(n[1][0] - n[0][0]) + lambda_b*(n[2][0] - n[0][0]);
            float ny = n[0][1] + lambda_a*(n[1][1] - n[0][1]) + lambda_b*(n[2][1] - n[0][1]);
            float nz = n[0][2] + lambda_a*(n[1][2] - n[0][2]) + lambda_b*(n[2][2] - n[0][2]);

            printf("%f %f %f %f %f %f %d %d %d\n", px, py, pz, nx, ny, nz, int(r), int(g), int(b));
        }

    }


    stbi_image_free(image);

    return 0;
}